

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpTestLog.c
# Opt level: O2

deBool qpTestLog_writeValueFloat(qpTestLog *log,double value)

{
  deBool dVar1;
  char tmpString [512];
  
  deSprintf(tmpString,0x200,"%f");
  deMutex_lock(log->lock);
  dVar1 = qpXmlWriter_writeStringElement(log->writer,"Value",tmpString);
  if (dVar1 == 0) {
    qpPrintf("qpTestLog_writeSampleValue(): Writing XML failed\n");
  }
  deMutex_unlock(log->lock);
  return (uint)(dVar1 != 0);
}

Assistant:

deBool qpTestLog_writeValueFloat (qpTestLog* log, double value)
{
	char tmpString[512];
	doubleToString(value, tmpString, (int)sizeof(tmpString));

	deMutex_lock(log->lock);

	DE_ASSERT(ContainerStack_getTop(&log->containerStack) == CONTAINERTYPE_SAMPLE);

	if (!qpXmlWriter_writeStringElement(log->writer, "Value", &tmpString[0]))
	{
		qpPrintf("qpTestLog_writeSampleValue(): Writing XML failed\n");
		deMutex_unlock(log->lock);
		return DE_FALSE;
	}

	deMutex_unlock(log->lock);
	return DE_TRUE;
}